

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2WithImpl::getRawDecomposition
          (Normalizer2WithImpl *this,UChar32 c,UnicodeString *decomposition)

{
  UnicodeString *this_00;
  ConstChar16Ptr local_80;
  UChar *local_78;
  UChar *d;
  UChar local_68 [2];
  int32_t length;
  UChar buffer [30];
  UnicodeString *decomposition_local;
  UChar32 c_local;
  Normalizer2WithImpl *this_local;
  
  unique0x100000c5 = decomposition;
  local_78 = Normalizer2Impl::getRawDecomposition(this->impl,c,local_68,(int32_t *)((long)&d + 4));
  this_00 = stack0xffffffffffffffd8;
  if (local_78 == (UChar *)0x0) {
    this_local._7_1_ = '\0';
  }
  else {
    if (local_78 == local_68) {
      UnicodeString::setTo(stack0xffffffffffffffd8,local_68,d._4_4_);
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(&local_80,local_78);
      UnicodeString::setTo(this_00,'\0',&local_80,d._4_4_);
      ConstChar16Ptr::~ConstChar16Ptr(&local_80);
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

virtual UBool
    getRawDecomposition(UChar32 c, UnicodeString &decomposition) const {
        UChar buffer[30];
        int32_t length;
        const UChar *d=impl.getRawDecomposition(c, buffer, length);
        if(d==NULL) {
            return FALSE;
        }
        if(d==buffer) {
            decomposition.setTo(buffer, length);  // copy the string (algorithmic decomposition)
        } else {
            decomposition.setTo(FALSE, d, length);  // read-only alias
        }
        return TRUE;
    }